

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-cave-util.c
# Opt level: O1

_Bool borg_cave_floor_bold(wchar_t y,wchar_t X)

{
  uint8_t uVar1;
  chunk_conflict *c;
  _Bool _Var2;
  loc grid;
  
  c = cave;
  grid = (loc)loc(X,y);
  _Var2 = square_in_bounds_fully(c,grid);
  if (_Var2) {
    uVar1 = borg_grids[y][X].feat;
    if (uVar1 == '\x01') {
      return true;
    }
    if ((byte)(uVar1 - 3) < 4) {
      return true;
    }
    if (borg_grids[y][X].trap != false) {
      return true;
    }
  }
  return false;
}

Assistant:

bool borg_cave_floor_bold(int y, int X)
{
    if (square_in_bounds_fully(cave, loc(X, y))) {
        if ((borg_grids[y][X].feat == FEAT_FLOOR) || (borg_grids[y][X].trap)
            || (borg_grids[y][X].feat == FEAT_LESS)
            || (borg_grids[y][X].feat == FEAT_MORE)
            || (borg_grids[y][X].feat == FEAT_BROKEN)
            || (borg_grids[y][X].feat == FEAT_OPEN))
            return true;
    }
    return false;
}